

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O1

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::mem_cache
          (mem_cache<cppcms::impl::process_settings> *this,uint pages)

{
  _Rb_tree_header *p_Var1;
  mutex *this_00;
  shared_mutex *this_01;
  
  (this->super_base_cache)._vptr_base_cache = (_func_int **)&PTR_fetch_0028bff8;
  this_00 = (mutex *)operator_new(0x38);
  mutex::mutex(this_00);
  (this->lru_mutex)._M_t.
  super___uniq_ptr_impl<cppcms::impl::mutex,_std::default_delete<cppcms::impl::mutex>_>._M_t.
  super__Tuple_impl<0UL,_cppcms::impl::mutex_*,_std::default_delete<cppcms::impl::mutex>_>.
  super__Head_base<0UL,_cppcms::impl::mutex_*,_false>._M_head_impl = this_00;
  this_01 = (shared_mutex *)operator_new(0x48);
  shared_mutex::shared_mutex(this_01);
  (this->access_lock)._M_t.
  super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
  .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl = this_01;
  p_Var1 = &(this->timeout)._M_t._M_impl.super__Rb_tree_header;
  (this->timeout)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->timeout)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->primary).impl_.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->primary).impl_.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->primary).impl_.hash_.super__Vector_base<_22329872_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->primary).impl_.list_.begin = (container *)0x0;
  (this->primary).impl_.list_.end = (container *)0x0;
  (this->primary).impl_.size_ = 0;
  (this->triggers).impl_.hash_.super__Vector_base<_8fa62532_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->triggers).impl_.hash_.super__Vector_base<_8fa62532_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->triggers).impl_.hash_.super__Vector_base<_8fa62532_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->triggers).impl_.list_.begin = (container *)0x0;
  (this->triggers).impl_.list_.end = (container *)0x0;
  (this->triggers).impl_.size_ = 0;
  (this->timeout)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->timeout)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->timeout)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->lru;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->lru;
  (this->lru).
  super__List_base<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator,_cppcms::impl::process_settings::process_memory>_>
  ._M_impl._M_node._M_size = 0;
  this->limit = pages;
  this->size = 0;
  this->refs = 0;
  this->generation = 0;
  nl_clear(this);
  return;
}

Assistant:

mem_cache(unsigned pages=0) : 
		lru_mutex(new mutex_type()),
		access_lock(new shared_mutex_type()),
		limit(pages),
		size(0),
		refs(0),
		generation(0)
	{
		nl_clear();
	}